

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O1

bool __thiscall csv::CSVField::try_parse_decimal(CSVField *this,longdouble *dVal,char decimalSymbol)

{
  bool bVar1;
  DataType DVar2;
  char in_R8B;
  string_view in;
  
  switch(this->_type) {
  case CSV_NULL:
    goto switchD_00109d8e_caseD_0;
  case UNKNOWN:
  case CSV_STRING:
  case CSV_DOUBLE:
    in._M_str = (char *)this;
    in._M_len = (size_t)(this->sv)._M_str;
    DVar2 = internals::data_type
                      ((internals *)(this->sv)._M_len,in,
                       (longdouble *)(ulong)(uint)(int)decimalSymbol,in_R8B);
    this->_type = DVar2;
  }
  if ((uint)(this->_type + ~CSV_STRING) < 6) {
    *dVal = this->value;
    bVar1 = true;
  }
  else {
switchD_00109d8e_caseD_0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

CSV_INLINE bool CSVField::try_parse_decimal(long double& dVal, const char decimalSymbol) {
        // If field has already been parsed to empty, no need to do it aagin:
        if (this->_type == DataType::CSV_NULL)
                    return false;

        // Not yet parsed or possibly parsed with other decimalSymbol
        if (this->_type == DataType::UNKNOWN || this->_type == DataType::CSV_STRING || this->_type == DataType::CSV_DOUBLE)
            this->_type = internals::data_type(this->sv, &this->value, decimalSymbol); // parse again

        // Integral types are not affected by decimalSymbol and need not be parsed again

        // Either we already had an integral type before, or we we just got any numeric type now.
        if (this->_type >= DataType::CSV_INT8 && this->_type <= DataType::CSV_DOUBLE) {
            dVal = this->value;
            return true;
        }

        // CSV_NULL or CSV_STRING, not numeric
        return false;
    }